

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klogic.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
klogic::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,
                  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v)

{
  bool bVar1;
  complex *pcVar2;
  ostream *poVar3;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_28;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_20;
  const_iterator i;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  i._M_current = (complex<double> *)v;
  std::operator<<((ostream *)os,'[');
  local_20._M_current =
       (complex<double> *)
       std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                 ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                  i._M_current);
  while( true ) {
    local_28._M_current =
         (complex<double> *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                   ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                    i._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pcVar2 = (complex *)
             __gnu_cxx::
             __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
             ::operator*(&local_20);
    std::operator<<((ostream *)os,pcVar2);
    __gnu_cxx::
    __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
    ::operator++(&local_20);
  }
  poVar3 = std::operator<<((ostream *)os,']');
  return (basic_ostream<char,_std::char_traits<char>_> *)poVar3;
}

Assistant:

Stream &operator<<(Stream& os, const std::vector<T> &v) {
        os << '[';
        for (typename std::vector<T>::const_iterator i = v.begin(); i != v.end(); ++i) {
            os << *i;
        }
        return os << ']';
    }